

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::NormalizeFindResult(cmFindBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  string *psVar5;
  cmake *pcVar6;
  string *psVar7;
  pointer pcVar8;
  size_type sVar9;
  cmMakefile *pcVar10;
  string_view value_00;
  string_view value_01;
  string value;
  allocator<char> local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  if (PVar3 != NEW) {
    if (this->StoreResultInCache == true) {
      if (this->AlreadyInCacheWithoutMetaInfo != true) {
        return;
      }
      psVar7 = &this->VariableName;
      cmMakefile::AddCacheDefinition
                ((this->super_cmFindCommon).Makefile,psVar7,"",
                 (this->VariableDocumentation)._M_dataplus._M_p,this->VariableType,false);
      PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
      if (PVar3 != NEW) {
        return;
      }
      bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar7);
      if (!bVar2) {
        return;
      }
      pcVar10 = (this->super_cmFindCommon).Makefile;
      pcVar6 = cmMakefile::GetCMakeInstance(pcVar10);
      psVar7 = (string *)cmake::GetCacheDefinition(pcVar6,psVar7);
      if (psVar7 == (string *)0x0) {
        psVar7 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar8 = (psVar7->_M_dataplus)._M_p;
      sVar9 = psVar7->_M_string_length;
    }
    else {
      pcVar10 = (this->super_cmFindCommon).Makefile;
      psVar7 = cmMakefile::GetSafeDefinition(pcVar10,&this->VariableName);
      pcVar8 = (psVar7->_M_dataplus)._M_p;
      sVar9 = psVar7->_M_string_length;
    }
    value_01._M_str = pcVar8;
    value_01._M_len = sVar9;
    cmMakefile::AddDefinition(pcVar10,&this->VariableName,value_01);
    return;
  }
  psVar7 = &this->VariableName;
  psVar5 = (string *)cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,psVar7);
  paVar1 = &local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_150._M_dataplus._M_p = (pointer)paVar1;
  if (psVar5->_M_string_length != 0) {
    pcVar8 = (psVar5->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar8,pcVar8 + psVar5->_M_string_length);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_a8,&local_110,auto_format);
    pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar8 = (pcVar6->CMakeWorkingDirectory)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar8,pcVar8 + (pcVar6->CMakeWorkingDirectory)._M_string_length
              );
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_d0,&local_130,generic_format);
    cmCMakePath::Absolute((cmCMakePath *)&local_80,(cmCMakePath *)&local_a8,&local_d0);
    cmCMakePath::Normal((cmCMakePath *)&local_58,(cmCMakePath *)&local_80);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_f0,&local_58,&local_151);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_58);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::filesystem::__cxx11::path::~path(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    bVar2 = cmsys::SystemTools::FileExists(&local_150,false);
    if (!bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_150);
    }
  }
  if (this->StoreResultInCache == true) {
    if ((local_150._M_string_length == psVar5->_M_string_length) &&
       (((local_150._M_string_length == 0 ||
         (iVar4 = bcmp(local_150._M_dataplus._M_p,(psVar5->_M_dataplus)._M_p,
                       local_150._M_string_length), iVar4 == 0)) &&
        (this->AlreadyInCacheWithoutMetaInfo != true)))) goto LAB_00540d8e;
    pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    cmake::AddCacheEntry
              (pcVar6,psVar7,&local_150,(this->VariableDocumentation)._M_dataplus._M_p,
               this->VariableType);
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    pcVar10 = (this->super_cmFindCommon).Makefile;
    if (PVar3 != NEW) {
      cmMakefile::RemoveDefinition(pcVar10,psVar7);
      goto LAB_00540d8e;
    }
    bVar2 = cmMakefile::IsNormalDefinitionSet(pcVar10,psVar7);
    if (!bVar2) goto LAB_00540d8e;
  }
  value_00._M_str = local_150._M_dataplus._M_p;
  value_00._M_len = local_150._M_string_length;
  cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,psVar7,value_00);
LAB_00540d8e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindBase::NormalizeFindResult()
{
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) ==
      cmPolicies::NEW) {
    // ensure the path returned by find_* command is absolute
    const auto& existingValue =
      this->Makefile->GetDefinition(this->VariableName);
    std::string value;
    if (!existingValue->empty()) {
      value =
        cmCMakePath(*existingValue, cmCMakePath::auto_format)
          .Absolute(cmCMakePath(
            this->Makefile->GetCMakeInstance()->GetCMakeWorkingDirectory()))
          .Normal()
          .GenericString();
      // value = cmSystemTools::CollapseFullPath(*existingValue);
      if (!cmSystemTools::FileExists(value, false)) {
        value = *existingValue;
      }
    }

    if (this->StoreResultInCache) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the original
      // value.
      if (value != *existingValue || this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->GetCMakeInstance()->AddCacheEntry(
          this->VariableName, value, this->VariableDocumentation.c_str(),
          this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
            cmPolicies::NEW) {
          if (this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
            this->Makefile->AddDefinition(this->VariableName, value);
          }
        } else {
          // if there was a definition then remove it
          // This is required to ensure same behavior as
          // cmMakefile::AddCacheDefinition.
          this->Makefile->RemoveDefinition(this->VariableName);
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(this->VariableName, value);
    }
  } else {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->StoreResultInCache) {
      if (this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->AddCacheDefinition(this->VariableName, "",
                                           this->VariableDocumentation.c_str(),
                                           this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
              cmPolicies::NEW &&
            this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
          this->Makefile->AddDefinition(
            this->VariableName,
            *this->Makefile->GetCMakeInstance()->GetCacheDefinition(
              this->VariableName));
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(
        this->VariableName,
        this->Makefile->GetSafeDefinition(this->VariableName));
    }
  }
}